

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O2

void bloaty::macho::ParseSegment<segment_command,section>(LoadCommand cmd,RangeSink *sink)

{
  int iVar1;
  uint uVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  uint uVar5;
  segment_command *psVar6;
  section *s;
  ulong vmaddr;
  char *in_RSI;
  ulong in_R8;
  size_t off;
  uint32_t uVar7;
  bool bVar8;
  string_view name;
  string_view sVar9;
  string_view name_00;
  string_view name_01;
  string_view data;
  string_view data_00;
  string_view data_01;
  size_t local_a8;
  char *local_a0;
  string_view local_70;
  size_t local_60;
  char *local_58;
  string label;
  
  psVar6 = GetStructPointerAndAdvance<segment_command>(&cmd.command_data);
  name = ArrayToStr(psVar6->segname,(size_t)in_RSI);
  iVar1 = psVar6->maxprot;
  if (sink->data_source_ == kSections) {
    uVar7 = psVar6->nsects;
    while( true ) {
      bVar8 = uVar7 == 0;
      uVar7 = uVar7 - 1;
      if (bVar8) break;
      s = GetStructPointerAndAdvance<section>(&cmd.command_data);
      off = (size_t)s->size;
      uVar5 = (uint)(byte)s->flags;
      if ((uVar5 < 0x13) && ((0x41002U >> (uVar5 & 0x1f) & 1) != 0)) {
        off = 0;
      }
      local_70 = ArrayToStr(s->sectname,(size_t)in_RSI);
      local_a8 = name._M_len;
      local_60 = local_a8;
      local_a0 = name._M_str;
      local_58 = local_a0;
      absl::strings_internal::
      JoinTuple<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,0ul,1ul>
                (&label,(strings_internal *)&local_70,1,",");
      sVar4 = label._M_string_length;
      _Var3 = label._M_dataplus;
      if (iVar1 == 0) {
        sVar9._M_str._0_4_ = s->offset;
        sVar9._M_len = (size_t)cmd.file_data._M_str;
        sVar9._M_str._4_4_ = 0;
        sVar9 = StrictSubstr((bloaty *)cmd.file_data._M_len,sVar9,off,in_R8);
        in_R8 = sVar9._M_len;
        in_RSI = "macho_section";
        name_01._M_str = _Var3._M_p;
        name_01._M_len = sVar4;
        RangeSink::AddFileRange(sink,"macho_section",name_01,sVar9);
      }
      else {
        vmaddr = (ulong)s->addr;
        uVar5 = s->size;
        data_00._M_str._0_4_ = s->offset;
        data_00._M_len = (size_t)cmd.file_data._M_str;
        data_00._M_str._4_4_ = 0;
        sVar9 = StrictSubstr((bloaty *)cmd.file_data._M_len,data_00,off,in_R8);
        in_RSI = "macho_section";
        name_00._M_str = _Var3._M_p;
        name_00._M_len = sVar4;
        RangeSink::AddRange(sink,"macho_section",name_00,vmaddr,(ulong)uVar5,sVar9);
        in_R8 = vmaddr;
      }
      std::__cxx11::string::~string((string *)&label);
    }
  }
  else {
    if (sink->data_source_ != kSegments) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/macho.cc"
                    ,0x11f,
                    "void bloaty::macho::ParseSegment(LoadCommand, RangeSink *) [Segment = segment_command, Section = section]"
                   );
    }
    if (iVar1 == 0) {
      data_01._M_str._0_4_ = psVar6->fileoff;
      data_01._M_len = (size_t)cmd.file_data._M_str;
      data_01._M_str._4_4_ = 0;
      sVar9 = StrictSubstr((bloaty *)cmd.file_data._M_len,data_01,(ulong)psVar6->filesize,in_R8);
      RangeSink::AddFileRange(sink,"macho_segment",name,sVar9);
    }
    else {
      uVar5 = psVar6->vmaddr;
      uVar2 = psVar6->vmsize;
      data._M_str._0_4_ = psVar6->fileoff;
      data._M_len = (size_t)cmd.file_data._M_str;
      data._M_str._4_4_ = 0;
      sVar9 = StrictSubstr((bloaty *)cmd.file_data._M_len,data,(ulong)psVar6->filesize,in_R8);
      RangeSink::AddRange(sink,"macho_segment",name,(ulong)uVar5,(ulong)uVar2,sVar9);
    }
  }
  return;
}

Assistant:

void ParseSegment(LoadCommand cmd, RangeSink* sink) {
  auto segment = GetStructPointerAndAdvance<Segment>(&cmd.command_data);
  string_view segname = ArrayToStr(segment->segname, 16);

  // For unknown reasons, some load commands will have maxprot = NONE
  // indicating they are not accessible, but will also contain a vmaddr
  // and vmsize.  In practice the vmaddr/vmsize of a section sometimes
  // fall within the segment, but sometimes exceed it, leading to an
  // error about exceeding the base map.
  //
  // Since such segments should not be mapped, we simply ignore the
  // vmaddr/vmsize of such segments.
  bool unmapped = segment->maxprot == VM_PROT_NONE;

  if (sink->data_source() == DataSource::kSegments) {
    if (unmapped) {
      sink->AddFileRange(
          "macho_segment", segname,
          StrictSubstr(cmd.file_data, segment->fileoff, segment->filesize));
    } else {
      sink->AddRange(
          "macho_segment", segname, segment->vmaddr, segment->vmsize,
          StrictSubstr(cmd.file_data, segment->fileoff, segment->filesize));
    }
  } else if (sink->data_source() == DataSource::kSections) {
    uint32_t nsects = segment->nsects;
    for (uint32_t j = 0; j < nsects; j++) {
      auto section = GetStructPointerAndAdvance<Section>(&cmd.command_data);

      // filesize equals vmsize unless the section is zerofill
      uint64_t filesize = section->size;
      switch (section->flags & SECTION_TYPE) {
        case S_ZEROFILL:
        case S_GB_ZEROFILL:
        case S_THREAD_LOCAL_ZEROFILL:
          filesize = 0;
          break;
        default:
          break;
      }

      std::string label = absl::StrJoin(
          std::make_tuple(segname, ArrayToStr(section->sectname, 16)), ",");
      if (unmapped) {
        sink->AddFileRange(
            "macho_section", label,
            StrictSubstr(cmd.file_data, section->offset, filesize));
      } else {
        sink->AddRange("macho_section", label, section->addr, section->size,
                       StrictSubstr(cmd.file_data, section->offset, filesize));
      }
    }
  } else {
    BLOATY_UNREACHABLE();
  }
}